

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::parseNumber(Parser *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  Exception *this_00;
  Parser *in_RDI;
  double dVar5;
  ParsedNumber exponent;
  double fractionalPart;
  int i;
  bool negative;
  ParsedNumber numberValue;
  size_t startPos;
  undefined4 in_stack_ffffffffffffff68;
  ExceptionType in_stack_ffffffffffffff6c;
  Builder *in_stack_ffffffffffffff70;
  ParsedNumber *in_stack_ffffffffffffff78;
  Parser *in_stack_ffffffffffffff80;
  Parser *in_stack_ffffffffffffff88;
  Builder *v;
  Builder *in_stack_ffffffffffffff90;
  ParsedNumber local_50;
  double local_38;
  int local_30;
  byte local_29;
  ParsedNumber local_28;
  size_t local_10;
  
  local_10 = in_RDI->_pos;
  ParsedNumber::ParsedNumber(&local_28);
  local_29 = 0;
  local_30 = consume(in_RDI);
  if (local_30 == 0x2d) {
    local_30 = getOneOrThrow(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    local_29 = 1;
  }
  if ((local_30 < 0x30) || (0x39 < local_30)) {
    uVar3 = __cxa_allocate_exception(0x18);
    Exception::Exception
              ((Exception *)in_stack_ffffffffffffff80,
               (ExceptionType)((ulong)in_stack_ffffffffffffff78 >> 0x20),
               (char *)in_stack_ffffffffffffff70);
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  if (local_30 != 0x30) {
    unconsume(in_RDI);
    scanDigits(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  local_30 = consume(in_RDI);
  if ((local_30 < 0) || (((local_30 != 0x2e && (local_30 != 0x65)) && (local_30 != 0x45)))) {
    if (-1 < local_30) {
      unconsume(in_RDI);
    }
    if ((local_28.isInteger & 1U) == 0) {
      if ((local_29 & 1) == 0) {
        Builder::addDouble(in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
      }
      else {
        Builder::addDouble(in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
      }
    }
    else if ((local_29 & 1) == 0) {
      Builder::addUInt(in_stack_ffffffffffffff70,
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    else if (local_28.intValue < 0x8000000000000000) {
      Builder::addInt(in_stack_ffffffffffffff70,
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    else {
      uVar4 = toUInt64(-0x8000000000000000);
      if (local_28.intValue == uVar4) {
        Builder::addInt(in_stack_ffffffffffffff70,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
      else {
        Builder::addDouble(in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
      }
    }
  }
  else {
    if (local_30 == 0x2e) {
      local_30 = getOneOrThrow(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      if ((local_30 < 0x30) || (0x39 < local_30)) {
        uVar3 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffff80,
                   (ExceptionType)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   (char *)in_stack_ffffffffffffff70);
        __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
      }
      unconsume(in_RDI);
      local_38 = scanDigitsFractional(in_stack_ffffffffffffff88);
      if ((local_29 & 1) == 0) {
        dVar5 = ParsedNumber::asDouble(&local_28);
        local_38 = dVar5 + local_38;
      }
      else {
        dVar5 = ParsedNumber::asDouble(&local_28);
        local_38 = -dVar5 - local_38;
      }
      local_30 = consume(in_RDI);
      if (local_30 < 0) {
        Builder::addDouble(in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
        return;
      }
    }
    else if ((local_29 & 1) == 0) {
      local_38 = ParsedNumber::asDouble(&local_28);
    }
    else {
      local_38 = ParsedNumber::asDouble(&local_28);
      local_38 = -local_38;
    }
    if ((local_30 == 0x65) || (local_30 == 0x45)) {
      local_30 = getOneOrThrow(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      local_29 = 0;
      if ((local_30 == 0x2b) || (local_30 == 0x2d)) {
        local_29 = local_30 == 0x2d;
        local_30 = getOneOrThrow(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      }
      if ((local_30 < 0x30) || (0x39 < local_30)) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception
                  (this_00,(ExceptionType)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                   (char *)in_stack_ffffffffffffff70);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
      unconsume(in_RDI);
      ParsedNumber::ParsedNumber(&local_50);
      scanDigits(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if ((local_29 & 1) == 0) {
        dVar5 = ParsedNumber::asDouble(&local_50);
        dVar5 = pow(10.0,dVar5);
        local_38 = dVar5 * local_38;
      }
      else {
        dVar5 = ParsedNumber::asDouble(&local_50);
        dVar5 = pow(10.0,-dVar5);
        local_38 = dVar5 * local_38;
      }
      uVar2 = std::isnan(local_38);
      if (((uVar2 & 1) != 0) || (bVar1 = std::isfinite(local_38), !bVar1)) {
        uVar3 = __cxa_allocate_exception(0x18);
        Exception::Exception((Exception *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
      }
      atof((char *)(in_RDI->_start + local_10));
      Builder::addDouble(in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
    }
    else {
      unconsume(in_RDI);
      v = in_RDI->_builderPtr;
      atof((char *)(in_RDI->_start + local_10));
      Builder::addDouble(in_stack_ffffffffffffff90,(double)v);
    }
  }
  return;
}

Assistant:

void Parser::parseNumber() {
  std::size_t startPos = _pos;
  ParsedNumber numberValue;
  bool negative = false;
  int i = consume();
  // We know that a character is coming, and it's a number if it
  // starts with '-' or a digit. otherwise it's invalid
  if (i == '-') {
    i = getOneOrThrow("Incomplete number");
    negative = true;
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Expecting digit");
  }

  if (i != '0') {
    unconsume();
    scanDigits(numberValue);
  }
  i = consume();
  if (i < 0 || (i != '.' && i != 'e' && i != 'E')) {
    if (i >= 0) {
      unconsume();
    }
    if (!numberValue.isInteger) {
      if (negative) {
        _builderPtr->addDouble(-numberValue.doubleValue);
      } else {
        _builderPtr->addDouble(numberValue.doubleValue);
      }
    } else if (negative) {
      if (numberValue.intValue <= static_cast<uint64_t>(INT64_MAX)) {
        _builderPtr->addInt(-static_cast<int64_t>(numberValue.intValue));
      } else if (numberValue.intValue == toUInt64(INT64_MIN)) {
        _builderPtr->addInt(INT64_MIN);
      } else {
        _builderPtr->addDouble(-static_cast<double>(numberValue.intValue));
      }
    } else {
      _builderPtr->addUInt(numberValue.intValue);
    }
    return;
  }

  double fractionalPart;
  if (i == '.') {
    // fraction. skip over '.'
    i = getOneOrThrow("Incomplete number");
    if (i < '0' || i > '9') {
      throw Exception(Exception::ParseError, "Incomplete number");
    }
    unconsume();
    fractionalPart = scanDigitsFractional();
    if (negative) {
      fractionalPart = -numberValue.asDouble() - fractionalPart;
    } else {
      fractionalPart = numberValue.asDouble() + fractionalPart;
    }
    i = consume();
    if (i < 0) {
      _builderPtr->addDouble(fractionalPart);
      return;
    }
  } else {
    if (negative) {
      fractionalPart = -numberValue.asDouble();
    } else {
      fractionalPart = numberValue.asDouble();
    }
  }
  if (i != 'e' && i != 'E') {
    unconsume();
    // use conventional atof() conversion here, to avoid precision loss
    // when interpreting and multiplying the single digits of the input stream
    // _builderPtr->addDouble(fractionalPart);
    _builderPtr->addDouble(
        atof(reinterpret_cast<char const*>(_start) + startPos));
    return;
  }
  i = getOneOrThrow("Incomplete number");
  negative = false;
  if (i == '+' || i == '-') {
    negative = (i == '-');
    i = getOneOrThrow("Incomplete number");
  }
  if (i < '0' || i > '9') {
    throw Exception(Exception::ParseError, "Incomplete number");
  }
  unconsume();
  ParsedNumber exponent;
  scanDigits(exponent);
  if (negative) {
    fractionalPart *= pow(10, -exponent.asDouble());
  } else {
    fractionalPart *= pow(10, exponent.asDouble());
  }
  if (std::isnan(fractionalPart) || !std::isfinite(fractionalPart)) {
    throw Exception(Exception::NumberOutOfRange);
  }
  // use conventional atof() conversion here, to avoid precision loss
  // when interpreting and multiplying the single digits of the input stream
  // _builderPtr->addDouble(fractionalPart);
  _builderPtr->addDouble(
      atof(reinterpret_cast<char const*>(_start) + startPos));
}